

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_MeleeAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int MeleeDamage_00;
  AActor *self_00;
  MetaClass *pMVar1;
  bool bVar2;
  bool local_47;
  FSoundID local_44;
  FSoundID local_40;
  int local_3c;
  FSoundID MeleeSound;
  int MeleeDamage;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x3c2,
                  "int AF_AActor_A_MeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    _MeleeSound = (AActor *)(param->field_0).field_1.a;
    local_47 = true;
    if (_MeleeSound != (AActor *)0x0) {
      local_47 = DObject::IsKindOf((DObject *)_MeleeSound,AActor::RegistrationInfo.MyClass);
    }
    if (local_47 != false) {
      pMVar1 = AActor::GetClass(_MeleeSound);
      local_3c = pMVar1->MeleeDamage;
      pMVar1 = AActor::GetClass(_MeleeSound);
      FSoundID::FSoundID(&local_40,&pMVar1->MeleeSound);
      self_00 = _MeleeSound;
      MeleeDamage_00 = local_3c;
      FSoundID::FSoundID(&local_44,&local_40);
      DoAttack(self_00,true,false,MeleeDamage_00,&local_44,(PClassActor *)0x0,0.0);
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x3c2,
                  "int AF_AActor_A_MeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x3c2,
                "int AF_AActor_A_MeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MeleeAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	int MeleeDamage = self->GetClass()->MeleeDamage;
	FSoundID MeleeSound = self->GetClass()->MeleeSound;
	DoAttack(self, true, false, MeleeDamage, MeleeSound, NULL, 0);
	return 0;
}